

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.h
# Opt level: O2

data_type __thiscall bitmap::Bitmap::GetValPos(Bitmap *this,pos_type pos,width_type bits)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  
  uVar3 = (uint)pos & 0x3f;
  uVar2 = this->data_[pos >> 6];
  if ((int)CONCAT71(in_register_00000011,bits) + uVar3 < 0x41) {
    uVar2 = uVar2 >> (sbyte)uVar3;
  }
  else {
    bVar1 = (byte)pos & 0x3f;
    uVar2 = uVar2 >> bVar1 | this->data_[(pos >> 6) + 1] << 0x40 - bVar1;
  }
  return uVar2 & *(ulong *)(low_bits_set + (CONCAT71(in_register_00000011,bits) & 0xffffffff) * 8);
}

Assistant:

Bitmap::data_type Bitmap::GetValPos(pos_type pos, width_type bits) const {
  pos_type s_off = pos % 64;
  pos_type s_idx = pos / 64;

  if (s_off + bits <= 64) {
    // Can be read from a single block
    return (data_[s_idx] >> s_off) & low_bits_set[bits];
  } else {
    // Must be read from two blocks
    return ((data_[s_idx] >> s_off) | (data_[s_idx + 1] << (64 - s_off)))
        & low_bits_set[bits];
  }
}